

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase69::run(TestCase69 *this)

{
  Builder builder_00;
  Reader reader_00;
  Orphanage orphanage;
  StringPtr input;
  TextCodec codec;
  String text;
  Orphan<capnproto_test::capnp::test::TestDefaults> orphan;
  Builder local_248;
  ReaderFor<capnproto_test::capnp::test::TestDefaults> structReader;
  MallocMessageBuilder reader;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestDefaults>
            (&local_248,&builder.super_MessageBuilder);
  builder_00._builder.capTable = local_248._builder.capTable;
  builder_00._builder.segment = local_248._builder.segment;
  builder_00._builder.data = local_248._builder.data;
  builder_00._builder.pointers = local_248._builder.pointers;
  builder_00._builder.dataSize = local_248._builder.dataSize;
  builder_00._builder.pointerCount = local_248._builder.pointerCount;
  builder_00._builder._38_2_ = local_248._builder._38_2_;
  initTestMessage(builder_00);
  TextCodec::TextCodec(&codec);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestDefaults>
            ((Builder *)&reader,&builder.super_MessageBuilder);
  TextCodec::encode<capnproto_test::capnp::test::TestDefaults::Builder>
            (&text,&codec,(Builder *)&reader);
  MallocMessageBuilder::MallocMessageBuilder(&reader,0x400,GROW_HEURISTICALLY);
  orphanage = MessageBuilder::getOrphanage(&reader.super_MessageBuilder);
  input.content.size_ = text.content.size_ + (text.content.size_ == 0);
  if (text.content.size_ == 0) {
    text.content.ptr = "";
  }
  input.content.ptr = text.content.ptr;
  TextCodec::decode<capnproto_test::capnp::test::TestDefaults>(&orphan,&codec,input,orphanage);
  OrphanGetImpl<capnproto_test::capnp::test::TestDefaults,_(capnp::Kind)3>::applyReader
            (&structReader,&orphan.builder);
  reader_00._reader.capTable = structReader._reader.capTable;
  reader_00._reader.segment = structReader._reader.segment;
  reader_00._reader.data = structReader._reader.data;
  reader_00._reader.pointers = structReader._reader.pointers;
  reader_00._reader.dataSize = structReader._reader.dataSize;
  reader_00._reader.pointerCount = structReader._reader.pointerCount;
  reader_00._reader._38_2_ = structReader._reader._38_2_;
  reader_00._reader.nestingLimit = structReader._reader.nestingLimit;
  reader_00._reader._44_4_ = structReader._reader._44_4_;
  checkTestMessage(reader_00);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&reader);
  kj::Array<char>::~Array(&text.content);
  TextCodec::~TextCodec(&codec);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(DynamicApi, Defaults) {
  AlignedData<1> nullRoot = {{0, 0, 0, 0, 0, 0, 0, 0}};
  kj::ArrayPtr<const word> segments[1] = {kj::arrayPtr(nullRoot.words, 1)};
  SegmentArrayMessageReader reader(kj::arrayPtr(segments, 1));
  auto root = reader.getRoot<DynamicStruct>(Schema::from<TestDefaults>());
  checkDynamicTestMessage(root);
}